

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

ostream * operator<<(ostream *os,cmListFileContext *lfc)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,(lfc->FilePath)._M_dataplus._M_p,(lfc->FilePath)._M_string_length);
  if (lfc->Line < 1) {
    if (lfc->Line != -1) {
      return os;
    }
    pcVar3 = ":DEFERRED";
    lVar2 = 9;
    poVar1 = os;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,":",1);
    std::ostream::_M_insert<long>((long)os);
    if ((lfc->Name)._M_string_length == 0) {
      return os;
    }
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(lfc->Name)._M_dataplus._M_p,(lfc->Name)._M_string_length);
    pcVar3 = ")";
    lVar2 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, cmListFileContext const& lfc)
{
  os << lfc.FilePath;
  if (lfc.Line > 0) {
    os << ":" << lfc.Line;
    if (!lfc.Name.empty()) {
      os << " (" << lfc.Name << ")";
    }
  } else if (lfc.Line == cmListFileContext::DeferPlaceholderLine) {
    os << ":DEFERRED";
  }
  return os;
}